

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillScratchGpRegsBeforeEntry
          (RALocalAllocator *this,RegMask scratchRegs)

{
  byte *pbVar1;
  uint **ppuVar2;
  byte bVar3;
  byte bVar4;
  InstNode IVar5;
  uint *puVar6;
  char *pcVar7;
  long lVar8;
  BaseNode *pBVar9;
  WorkToPhysMap *__src;
  uint uVar10;
  PhysToWorkMap *pPVar11;
  uint *puVar12;
  uint *puVar13;
  undefined1 *puVar14;
  ZoneAllocator *pZVar15;
  undefined4 workId;
  RegGroup RVar16;
  Error EVar17;
  uint32_t uVar18;
  ulong uVar19;
  RAStackSlot *pRVar20;
  PhysToWorkMap *pPVar21;
  BaseRAPass *pBVar22;
  RABlock *pRVar23;
  BaseNode *pBVar24;
  byte bVar25;
  BaseRAPass *pBVar26;
  BaseRAPass *pBVar27;
  uint uVar28;
  uint uVar29;
  uint extraout_EDX;
  uint extraout_EDX_00;
  ulong uVar30;
  BaseRAPass *pBVar31;
  BaseRAPass *extraout_RDX;
  BaseRAPass *extraout_RDX_00;
  BaseRAPass *extraout_RDX_01;
  BaseRAPass *extraout_RDX_02;
  BaseRAPass *extraout_RDX_03;
  BaseRAPass *extraout_RDX_04;
  BaseRAPass *extraout_RDX_05;
  BaseRAPass *extraout_RDX_06;
  RABlock *block;
  BaseRAPass *pBVar32;
  BaseRAPass *pBVar33;
  uint uVar34;
  InstNode *pIVar35;
  BaseRAPass *pBVar37;
  BaseRAPass *pBVar38;
  BaseRAPass *pBVar39;
  BaseCompiler *pBVar40;
  uint uVar41;
  BaseRAPass *in_R8;
  BaseRAPass *in_R9;
  uint uVar42;
  uint uVar43;
  _func_int **pp_Var44;
  long lVar45;
  BaseRAPass *pBVar46;
  BaseRAPass *pBVar47;
  InstNode *pIVar48;
  int iVar49;
  BaseRAPass *pBVar50;
  BaseRAPass *pBVar51;
  BaseRAPass *pBVar52;
  BaseRAPass *pBVar53;
  long lVar54;
  bool bVar55;
  char cVar56;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined8 uStack_418;
  undefined8 uStack_410;
  long lStack_400;
  BaseRAPass *pBStack_3f8;
  InstNode *pIStack_3f0;
  BaseRAPass *pBStack_3e8;
  long lStack_3e0;
  BaseRAPass *pBStack_3d8;
  ulong uStack_3c8;
  BaseRAPass *pBStack_3c0;
  InstNode *pIStack_3b8;
  BaseRAPass *pBStack_3b0;
  BaseRAPass *pBStack_3a8;
  BaseRAPass *pBStack_3a0;
  BaseRAPass *pBStack_398;
  BaseRAPass *pBStack_390;
  BaseRAPass *pBStack_388;
  BaseRAPass *pBStack_380;
  BaseRAPass *pBStack_378;
  BaseRAPass *pBStack_370;
  BaseRAPass *pBStack_368;
  BaseRAPass *pBStack_360;
  BaseRAPass *pBStack_358;
  BaseRAPass *pBStack_350;
  code *pcStack_348;
  BaseRAPass *pBStack_340;
  BaseRAPass *pBStack_338;
  uint uStack_330;
  uint uStack_32c;
  BaseRAPass *pBStack_328;
  char cStack_31d;
  uint uStack_31c;
  BaseRAPass *pBStack_318;
  BaseRAPass *pBStack_310;
  BaseRAPass *pBStack_308;
  uint uStack_2fc;
  BaseRAPass *pBStack_2f8;
  BaseRAPass *pBStack_2f0;
  BaseRAPass *pBStack_2e8;
  _func_int **pp_Stack_2e0;
  BaseRAPass *pBStack_2d8;
  uint uStack_2cc;
  BaseRAPass *pBStack_2c8;
  InstNode *pIStack_2c0;
  ulong uStack_2b8;
  BaseRAPass *pBStack_2b0;
  ulong uStack_2a8;
  undefined1 auStack_2a0 [64];
  long alStack_260 [32];
  undefined8 auStack_160 [33];
  RALocalAllocator *pRStack_58;
  BaseRAPass *pBStack_50;
  BaseRAPass *pBVar36;
  
  if (scratchRegs != 0) {
    pBVar32 = (BaseRAPass *)this;
    do {
      uVar41 = 0;
      if (scratchRegs != 0) {
        for (; (scratchRegs >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      pBVar33 = (BaseRAPass *)(ulong)uVar41;
      pPVar21 = (this->_curAssignment)._physToWorkMap;
      uVar28 = 1 << ((byte)uVar41 & 0x1f);
      if (((pPVar21->assigned)._masks._data[0] >> (uVar41 & 0x1f) & 1) != 0) {
        pIVar35 = (InstNode *)(ulong)uVar41;
        uVar29 = (this->_curAssignment)._physToWorkIds._data[0][(long)pIVar35];
        pBVar46 = (BaseRAPass *)(ulong)uVar29;
        uVar42 = (pPVar21->dirty)._masks._data[0];
        if ((uVar42 & uVar28) != 0) {
          if (uVar29 == 0xffffffff) {
            spillScratchGpRegsBeforeEntry();
LAB_0012242e:
            spillScratchGpRegsBeforeEntry();
          }
          else {
            if ((this->_curAssignment)._layout.workCount <= uVar29) goto LAB_0012242e;
            bVar25 = (this->_curAssignment)._workToPhysMap[(long)pBVar46].physIds[0];
            pIVar35 = (InstNode *)(ulong)bVar25;
            if (uVar41 == bVar25) {
              (pPVar21->dirty)._masks._data[0] = uVar42 & ~uVar28;
              EVar17 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                                 (this->_pass,pBVar46,(ulong)uVar41);
              if (EVar17 != 0) {
                return EVar17;
              }
              goto LAB_00122403;
            }
          }
          spillScratchGpRegsBeforeEntry();
          pBStack_50 = pBVar46;
          pRStack_58 = this;
          pBVar31 = *(BaseRAPass **)(pIVar35 + 0x20);
          (((BaseCompiler *)(pBVar32->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
               *(BaseNode **)pIVar35;
          *(InstNode **)&pBVar32->_instructionCount = pIVar35;
          *(BaseRAPass **)&pBVar32->_sharedAssignments = pBVar31;
          *(uint32_t *)&pBVar32->field_0xf0 =
               *(uint32_t *)&(pBVar31->super_FuncPass).super_Pass._name;
          ((RARegCount *)&pBVar32->field_0xf4)->field_0 =
               (anon_union_4_2_ebeb14a8_for_RARegCount_0)
               (((RARegMask *)&pBVar31->_allocator)->_masks)._data[0];
          pBStack_308 = (BaseRAPass *)&pBVar32->field_0x48;
          auStack_2a0._56_8_ = pIVar35 + 0x40;
          pBVar52 = (BaseRAPass *)0x0;
          uStack_2a8 = 0;
          pBStack_340 = pBVar32;
          pIStack_2c0 = pIVar35;
          pBStack_2b0 = pBVar31;
          goto LAB_001224bb;
        }
LAB_00122403:
        pBVar32 = (BaseRAPass *)&this->_curAssignment;
        RAAssignment::unassign(&this->_curAssignment,k0,uVar29,uVar41);
      }
      scratchRegs = scratchRegs - 1 & scratchRegs;
    } while (scratchRegs != 0);
  }
  return 0;
LAB_001224bb:
  bVar25 = (char)pBVar52 * '\b';
  pBVar37 = *(BaseRAPass **)&pBVar32->_sharedAssignments;
  uVar41 = *(uint *)((long)&(pBVar37->super_FuncPass).super_Pass._name + 4) >> (bVar25 & 0x1f);
  pBVar22 = (BaseRAPass *)(ulong)uVar41;
  uStack_32c = (((RARegMask *)&pBVar37->field_0x28)->_masks)._data
               [(long)((long)&(pBVar52->super_FuncPass).super_Pass._vptr_Pass + 1)];
  uStack_2fc = (((RARegMask *)&pBVar37->field_0x38)->_masks)._data
               [(long)((long)&(pBVar52->super_FuncPass).super_Pass._vptr_Pass + 1)];
  pBVar27 = (BaseRAPass *)(ulong)uStack_2fc;
  cStack_31d = '\x01';
  uVar28 = (((RARegCount *)&pBVar32->field_0xf4)->field_0)._packed >> (bVar25 & 0x1f) & 0xff;
  pBVar50 = (BaseRAPass *)(ulong)uVar28;
  pBVar47 = pBVar32;
  pBVar53 = pBVar52;
  pBStack_338 = pBVar52;
  if (uVar28 == 0) {
    pBStack_2f0 = (BaseRAPass *)0x0;
    uStack_2cc = 0;
    pBStack_2e8 = (BaseRAPass *)0x0;
    uStack_31c = 0;
    pBVar51 = (BaseRAPass *)(ulong)uStack_2fc;
    cVar56 = cStack_31d;
  }
  else {
    uVar41 = uVar41 & 0xff;
    uStack_2b8 = (ulong)uVar41;
    pBVar39 = (BaseRAPass *)
              ((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
              ((ulong)(uVar41 << 5) - 0x24));
    pBStack_2f0 = (BaseRAPass *)(ulong)uVar28;
    pBStack_328 = (BaseRAPass *)0x0;
    uStack_31c = 0;
    uVar29 = 0;
    pBVar26 = pBVar27;
    pBVar36 = pBStack_2f0;
    pBVar38 = pBVar39;
    uVar30 = 0;
    do {
      uVar42 = *(uint *)&(pBVar38->super_FuncPass).super_Pass._cb;
      in_R8 = (BaseRAPass *)(ulong)uVar42;
      if ((uVar42 & 0x1c00) != 0) {
        uVar34 = uVar42 >> 0xd & 3;
        if ((uVar42 >> 0xc & 1) != 0) {
          uVar34 = 0;
        }
        pBVar26 = (BaseRAPass *)(ulong)uVar34;
        if ((uVar29 >> uVar34 & 1) != 0) {
          return 3;
        }
        uVar29 = uVar29 | 1 << (sbyte)uVar34;
        alStack_260[(ulong)uVar34 - 6] = (long)pBVar38;
      }
      pBVar27 = (BaseRAPass *)auStack_2a0._16_8_;
      if ((uVar42 & 0x40008) != 0) {
        uVar19 = (ulong)uStack_31c;
        uStack_31c = uStack_31c + 1;
        pBVar26 = (BaseRAPass *)(ulong)uStack_31c;
        alStack_260[uVar19] = (long)pBVar38;
      }
      uVar19 = uVar30;
      if ((uVar42 >> 0x10 & 1) != 0) {
        uVar19 = (ulong)((int)uVar30 + 1);
        auStack_160[uVar30] = pBVar38;
      }
      uStack_330 = uVar28;
      pBStack_318 = pBVar39;
      pBStack_2c8 = pBVar37;
      if ((uVar42 & 4) == 0) {
        in_R8 = (BaseRAPass *)(ulong)(uVar42 | 0x100);
        *(uint *)&(pBVar38->super_FuncPass).super_Pass._cb = uVar42 | 0x100;
        pBVar50 = (BaseRAPass *)(ulong)((int)pBVar50 - 1);
      }
      else if ((uVar42 >> 10 & 1) == 0) {
        uVar34 = *(uint *)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass;
        pBVar26 = (BaseRAPass *)0xffffffff;
        if ((ulong)uVar34 == 0xffffffff) goto LAB_001236cb;
        pBVar22 = pBVar38;
        pBVar51 = pBVar50;
        if ((((RAAssignment *)&pBVar32->field_0x48)->_layout).workCount <= uVar34)
        goto LAB_001236d0;
        bVar25 = ((RAAssignment *)&pBVar32->field_0x48)->_workToPhysMap[uVar34].physIds[0];
        bVar3 = *(undefined1 *)((long)&(pBVar38->super_FuncPass).super_Pass._cb + 6);
        pBVar26 = (BaseRAPass *)(ulong)bVar3;
        if (bVar3 == 0xff) {
          if (bVar25 != 0xff) {
            uVar43 = 1 << (bVar25 & 0x1f);
            in_R9 = (BaseRAPass *)(ulong)uVar43;
            uVar34 = ~uStack_32c & *(uint *)&(pBVar38->super_FuncPass).super_Pass._name;
            pBVar26 = (BaseRAPass *)(ulong)uVar34;
            if ((uVar34 >> (bVar25 & 0x1f) & 1) == 0) goto LAB_00122699;
            *(byte *)((long)&(pBVar38->super_FuncPass).super_Pass._cb + 6) = bVar25;
            *(uint *)&(pBVar38->super_FuncPass).super_Pass._cb = uVar42 | 0x100;
            if ((uVar42 & 2) != 0) {
              puVar6 = (((RAAssignment *)&pBVar32->field_0x48)->_physToWorkMap->dirty)._masks._data
                       + (long)pBVar52;
              *puVar6 = *puVar6 | uVar43;
            }
            goto LAB_00122687;
          }
        }
        else {
          uVar43 = 1 << (bVar3 & 0x1f);
          in_R9 = (BaseRAPass *)(ulong)uVar43;
          if ((uStack_32c >> (bVar3 & 0x1f) & 1) == 0) goto LAB_0012370c;
          if (bVar25 == bVar3) {
            *(uint *)&(pBVar38->super_FuncPass).super_Pass._cb = uVar42 | 0x100;
            pBVar26 = (BaseRAPass *)(ulong)(uVar42 | 0x100);
            if ((uVar42 & 2) != 0) {
              uVar42 = 1 << (bVar25 & 0x1f);
              in_R8 = (BaseRAPass *)(ulong)uVar42;
              puVar6 = (((RAAssignment *)&pBVar32->field_0x48)->_physToWorkMap->dirty)._masks._data
                       + (long)pBVar52;
              *puVar6 = *puVar6 | uVar42;
              pBVar26 = (BaseRAPass *)(ulong)CONCAT31((int3)(uVar34 >> 8),bVar25);
            }
LAB_00122687:
            pBVar50 = (BaseRAPass *)(ulong)((int)pBVar50 - 1);
            uStack_32c = uStack_32c | (uint)in_R9;
          }
          else {
            in_R9 = (BaseRAPass *)
                    (ulong)(uVar43 & (((RAAssignment *)&pBVar32->field_0x48)->_physToWorkMap->
                                     assigned)._masks._data[(long)pBVar52]);
LAB_00122699:
            pBStack_328 = (BaseRAPass *)(ulong)((uint)pBStack_328 | (uint)in_R9);
          }
        }
      }
      pBVar38 = (BaseRAPass *)&pBVar38->field_0x20;
      pBVar36 = (BaseRAPass *)(&pBVar36[-1].field_0x3b0 + 0xff);
      uVar30 = uVar19;
    } while (pBVar36 != (BaseRAPass *)0x0);
    uStack_2cc = (uint)uVar19;
    pBVar31 = pBStack_328;
    if (uVar29 == 0) {
      pBStack_2e8 = (BaseRAPass *)0x0;
      pBVar27 = pBVar26;
    }
    else {
      if ((uVar29 + 1 & uVar29) != 0) {
        return 3;
      }
      uVar42 = 0;
      if (~uVar29 != 0) {
        for (; (~uVar29 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      pBStack_2e8 = (BaseRAPass *)(ulong)uVar42;
      if (((ulong)(((FuncPass *)auStack_2a0._16_8_)->super_Pass)._cb & 0x400) != 0) {
        uVar29 = (((RARegMask *)&pBVar32->_allocator)->_masks)._data[(long)pBVar52];
        if (uVar42 != 0) {
          uVar34 = (((RAAssignment *)&pBVar32->field_0x48)->_layout).workCount;
          pBVar38 = (BaseRAPass *)(ulong)uVar34;
          pBVar22 = (BaseRAPass *)((RAAssignment *)&pBVar32->field_0x48)->_workToPhysMap;
          in_R8 = (BaseRAPass *)0x0;
          do {
            in_R9 = (BaseRAPass *)(ulong)*(uint *)alStack_260[(long)&in_R8[-1].field_0x4aa];
            pBVar26 = pBVar33;
            pBVar51 = pBVar50;
            if (in_R9 == (BaseRAPass *)0xffffffff) goto LAB_001236f3;
            if (uVar34 <= *(uint *)alStack_260[(long)&in_R8[-1].field_0x4aa]) goto LAB_001236f8;
            *(uint *)(auStack_2a0 + (long)in_R8 * 4) =
                 (uint)*(byte *)((long)&pBVar22[1].super_FuncPass.super_Pass._vptr_Pass +
                                (long)(in_R9 + -1));
            in_R8 = (BaseRAPass *)((long)&(in_R8->super_FuncPass).super_Pass._vptr_Pass + 1);
          } while (pBStack_2e8 != in_R8);
        }
        uVar34 = *(uint *)&(pBVar27->super_FuncPass).super_Pass._name;
        if (uVar34 == 0) {
          return 0x3d;
        }
        pBVar22 = (BaseRAPass *)(pBVar32->super_FuncPass).super_Pass._vptr_Pass;
        in_R8 = (BaseRAPass *)(ulong)(uVar42 * 4);
        pBVar26 = (BaseRAPass *)0xffffffff;
        in_R9 = (BaseRAPass *)0x0;
        uVar43 = uVar34;
        do {
          uVar10 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          pBStack_310 = pBStack_2e8;
          if ((uVar34 >> (uVar10 & 0x1f) & 1) != 0) {
            if (uVar42 == 0) {
              this = (RALocalAllocator *)0xf;
            }
            else {
              pBVar27 = (BaseRAPass *)(ulong)uVar10;
              this = (RALocalAllocator *)0xf;
              pBVar47 = (BaseRAPass *)0x0;
              do {
                if ((((uVar29 | (uint)pBStack_328) & ~uStack_32c) >> ((uint)pBVar27 & 0x1f) & 1) ==
                    0) {
                  this = (RALocalAllocator *)0x0;
                  break;
                }
                if (*(uint *)&pBVar22->field_0x148 <=
                    **(uint **)(auStack_2a0 + (long)pBVar47 * 2 + 0x10)) {
                  pcStack_348 = (code *)0x123696;
                  allocInst();
                  goto LAB_00123696;
                }
                bVar55 = pBVar27 ==
                         (BaseRAPass *)
                         (ulong)*(byte *)(*(long *)(*(long *)&pBVar22->_workRegs +
                                                   (ulong)**(uint **)(auStack_2a0 +
                                                                     (long)pBVar47 * 2 + 0x10) * 8)
                                         + 0x4a);
                pBVar33 = (BaseRAPass *)(ulong)bVar55;
                pBVar46 = (BaseRAPass *)(ulong)*(uint *)(auStack_2a0 + (long)pBVar47);
                this = (RALocalAllocator *)
                       (ulong)((int)this + (uint)bVar55 + (uint)(pBVar27 == pBVar46) * 2);
                pBVar47 = (BaseRAPass *)((long)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass + 4)
                ;
                pBVar27 = (BaseRAPass *)((long)&(pBVar27->super_FuncPass).super_Pass._vptr_Pass + 1)
                ;
                pBVar32 = pBStack_340;
              } while (in_R8 != pBVar47);
            }
            if ((uint)in_R9 < (uint)this) {
              pBVar26 = (BaseRAPass *)(ulong)uVar10;
              in_R9 = (BaseRAPass *)this;
            }
          }
          uVar43 = uVar43 - 1 & uVar43;
        } while (uVar43 != 0);
        if ((int)pBVar26 == -1) {
          return 0x3d;
        }
        pBVar27 = pBVar26;
        pBVar47 = pBVar32;
        if (uVar42 != 0) {
          uVar30 = 0;
          do {
            uVar34 = 1 << ((byte)pBVar26 & 0x1f);
            pBVar36 = (BaseRAPass *)(ulong)uVar34;
            pBVar22 = *(BaseRAPass **)(auStack_2a0 + uVar30 + 0x10);
            uVar29 = *(uint *)&(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
            in_R8 = (BaseRAPass *)(ulong)uVar29;
            in_R9 = (BaseRAPass *)0xffffffff;
            if (in_R8 == (BaseRAPass *)0xffffffff) goto LAB_00123711;
            if ((((RAAssignment *)&pBVar32->field_0x48)->_layout).workCount <= uVar29)
            goto LAB_00123716;
            in_R9 = (BaseRAPass *)((RAAssignment *)&pBVar32->field_0x48)->_workToPhysMap;
            bVar25 = *(byte *)((long)&in_R9[1].super_FuncPass.super_Pass._vptr_Pass +
                              (long)(in_R8 + -1));
            in_R8 = (BaseRAPass *)(ulong)bVar25;
            *(byte *)((long)&(pBVar22->super_FuncPass).super_Pass._cb + 6) = (byte)pBVar26;
            if ((uint)pBVar26 == (uint)bVar25) {
              uVar29 = *(uint *)&(pBVar22->super_FuncPass).super_Pass._cb;
              in_R8 = (BaseRAPass *)(ulong)uVar29;
              in_R9 = (BaseRAPass *)(ulong)(uVar29 | 0x100);
              *(uint *)&(pBVar22->super_FuncPass).super_Pass._cb = uVar29 | 0x100;
              if ((uVar29 & 2) != 0) {
                puVar6 = (((RAAssignment *)&pBVar32->field_0x48)->_physToWorkMap->dirty)._masks.
                         _data + (long)pBVar52;
                *puVar6 = *puVar6 | uVar34;
              }
              pBVar50 = (BaseRAPass *)(ulong)((int)pBVar50 - 1);
            }
            else {
              pBVar31 = (BaseRAPass *)
                        (ulong)((uint)pBVar31 |
                               (((RAAssignment *)&pBVar32->field_0x48)->_physToWorkMap->assigned).
                               _masks._data[(long)pBVar52] & uVar34);
            }
            uStack_32c = uStack_32c | uVar34;
            uVar30 = uVar30 + 8;
            pBVar26 = (BaseRAPass *)(ulong)((uint)pBVar26 + 1);
            pBVar27 = pBVar26;
          } while (uVar42 << 3 != uVar30);
        }
      }
    }
    pBVar36 = pBVar39;
    if ((int)pBVar50 == 0) {
      pBVar50 = (BaseRAPass *)0x0;
    }
    else if (uVar28 != 0) {
      pBVar22 = (BaseRAPass *)
                (ulong)(~(uint)pBVar31 &
                       (((RAAssignment *)&pBVar47->field_0x48)->_physToWorkMap->assigned)._masks.
                       _data[(long)pBVar52]);
      uVar41 = uVar41 << 5;
      pBVar46 = (BaseRAPass *)
                ((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
                ((ulong)uVar41 - 0xc));
      in_R8 = (BaseRAPass *)(ulong)(uVar28 << 5);
      pBVar33 = (BaseRAPass *)0x0;
      pBVar27 = pBVar37;
      pBStack_2f8 = in_R8;
      do {
        uVar28 = *(uint *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
                           ((ulong)uVar41 - 0x1c) + (long)pBVar33);
        if ((uVar28 >> 8 & 1) == 0) {
          uVar29 = *(uint *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
                             ((ulong)uVar41 - 0x24) + (long)pBVar33);
          this = (RALocalAllocator *)(ulong)uVar29;
          pBVar26 = (BaseRAPass *)0xffffffff;
          if ((BaseRAPass *)this == (BaseRAPass *)0xffffffff) goto LAB_00123702;
          if ((((RAAssignment *)&pBVar47->field_0x48)->_layout).workCount <= uVar29)
          goto LAB_00123707;
          pBVar26 = (BaseRAPass *)((RAAssignment *)&pBVar47->field_0x48)->_workToPhysMap;
          bVar25 = *(byte *)((long)&pBVar26[1].super_FuncPass.super_Pass._vptr_Pass +
                            (long)((long)this + -0x4b0));
          pBVar47 = (BaseRAPass *)(ulong)bVar25;
          iVar49 = (int)pBVar50;
          if ((((uStack_2a8 & 1) == 0) && ((uVar28 & 0x10) != 0)) && (bVar25 == 0xff)) {
            uVar28 = *(uint *)((long)&pBVar46->_archTraits + (long)&pBVar33[-1].field_0x3b0);
            pBVar52 = (BaseRAPass *)(ulong)uVar28;
            uVar42 = uVar28 ^ uVar28 - 1;
            pBVar26 = (BaseRAPass *)(ulong)uVar42;
            if (uVar28 - 1 < uVar42) {
              pp_Var44 = (pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
              if (*(uint *)(pp_Var44 + 0x29) <= uVar29) goto LAB_00123720;
              pBVar26 = *(BaseRAPass **)(pp_Var44[0x28] + (long)this * 8);
              bVar3 = *(byte *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data
                                + ((ulong)uVar41 - 0x17) + (long)pBVar33);
              in_R9 = (BaseRAPass *)(ulong)bVar3;
              pBVar40 = (BaseCompiler *)(pBVar26->super_FuncPass).super_Pass._cb;
              uVar42._0_1_ = (pBVar40->super_BaseBuilder).super_BaseEmitter._emitterType;
              uVar42._1_1_ = (pBVar40->super_BaseBuilder).super_BaseEmitter._emitterFlags;
              uVar42._2_1_ = (pBVar40->super_BaseBuilder).super_BaseEmitter._instructionAlignment;
              uVar42._3_1_ = (pBVar40->super_BaseBuilder).super_BaseEmitter._reservedBaseEmitter;
              if (bVar3 <= uVar42) {
                if (*(long *)(((RARegMask *)&pBVar26->_allocator)->_masks)._data == 0) {
                  pBStack_310 = (BaseRAPass *)CONCAT44(pBStack_310._4_4_,(int)pBVar22);
                  pcStack_348 = (code *)0x122a33;
                  pBStack_328 = pBVar31;
                  pp_Stack_2e0 = pp_Var44;
                  pRVar20 = RAStackAllocator::newSlot
                                      ((RAStackAllocator *)(pp_Var44 + 0x3f),
                                       *(uint32_t *)((long)pp_Var44 + 0x1dc),uVar42,
                                       (uint)(byte)(char)(pBVar40->super_BaseBuilder).
                                                         super_BaseEmitter._validationFlags,1);
                  pBVar22 = (BaseRAPass *)((ulong)pBStack_310 & 0xffffffff);
                  *(RAStackSlot **)(((RARegMask *)&pBVar26->_allocator)->_masks)._data = pRVar20;
                  pBVar26->field_0x25 = pBVar26->field_0x25 | 1;
                  pBVar39 = pBStack_318;
                  in_R8 = pBStack_2f8;
                  pBVar31 = pBStack_328;
                  pp_Var44 = pp_Stack_2e0;
                }
                uVar29 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                pIVar35 = (InstNode *)(auStack_2a0._56_8_ + (ulong)(uVar29 & 0xfffffffc) * 4);
                uVar28 = *(uint *)(pp_Var44 + 0x3b);
                *(uint32_t *)(pIVar35 + 4) =
                     *(uint32_t *)((long)&(pBVar26->super_FuncPass).super_Pass._vptr_Pass + 4);
                *(undefined8 *)(pIVar35 + 8) = 0;
                in_R9 = (BaseRAPass *)((ulong)bVar3 << 0x18);
                uVar28 = (uVar28 & 0xf8) + (int)in_R9 + 0x2002;
                pBVar27 = (BaseRAPass *)(ulong)uVar28;
                *(uint *)pIVar35 = uVar28;
                *(undefined4 *)((long)&pBVar46->_archTraits + (long)&pBVar33[-1].field_0x3b0) = 0;
                pbVar1 = (byte *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds).
                                        _data + ((ulong)uVar41 - 0x1b) + (long)pBVar33);
                *pbVar1 = *pbVar1 | 1;
                puVar14 = (undefined1 *)((long)&(pBStack_2b0->super_FuncPass).super_Pass._cb + 7);
                *puVar14 = *puVar14 | 0x40;
                pBVar50 = (BaseRAPass *)(ulong)(iVar49 - 1);
                uStack_2a8 = CONCAT71((int7)((ulong)pBStack_2b0 >> 8),1);
                this = (RALocalAllocator *)pBVar26;
                pBVar47 = pBStack_340;
                pBVar52 = pBStack_338;
                goto LAB_00122bd1;
              }
            }
          }
          pBVar27 = pBVar26;
          pBVar47 = pBStack_340;
          pBVar52 = pBStack_338;
          if (*(char *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
                        ((ulong)uVar41 - 0x16) + (long)pBVar33) == -1) {
            pBStack_310 = (BaseRAPass *)CONCAT44(pBStack_310._4_4_,(int)pBVar22);
            pp_Stack_2e0 = (_func_int **)CONCAT44(pp_Stack_2e0._4_4_,(uint)(RegGroup)pBStack_338);
            pcStack_348 = (code *)0x122aeb;
            uVar18 = decideOnAssignment((RALocalAllocator *)pBStack_340,(RegGroup)pBStack_338,uVar29
                                        ,(uint32_t)pBVar26,
                                        ~(uStack_32c | (uint)pBVar31) &
                                        *(uint *)((long)(((RAAssignment *)&pBVar37->field_0x48)->
                                                        _physToWorkIds)._data +
                                                  ((ulong)uVar41 - 0x14) + (long)pBVar33));
            pBVar27 = (BaseRAPass *)(ulong)uVar18;
            uVar28 = 1 << ((byte)uVar18 & 0x1f);
            in_R9 = (BaseRAPass *)(ulong)uVar28;
            uVar42 = (uint)pBVar31 | uVar28 & (uint)pBStack_310;
            pBVar31 = (BaseRAPass *)(ulong)uVar42;
            *(byte *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
                      ((ulong)uVar41 - 0x16) + (long)pBVar33) = (byte)uVar18;
            uVar34 = (uint)bVar25;
            pBVar47 = pBStack_340;
            if (uVar34 == 0xff) {
              uVar42 = (uint)pBStack_310;
              if ((uVar28 & (uint)pBStack_310) == 0) {
                pBStack_2d8 = (BaseRAPass *)CONCAT44(pBStack_2d8._4_4_,uVar28);
                pcStack_348 = (code *)0x122c03;
                pBStack_328 = pBVar31;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_308,(RegGroup)pp_Stack_2e0,uVar29,uVar18,false);
                pBVar47 = pBStack_340;
                pBVar32 = (BaseRAPass *)(pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_348 = (code *)0x122c19;
                EVar17 = (*(pBVar32->super_FuncPass).super_Pass._vptr_Pass[0xb])
                                   (pBVar32,this,pBVar27);
                if (EVar17 != 0) {
                  return EVar17;
                }
                uVar28 = *(uint *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds).
                                         _data + ((ulong)uVar41 - 0x1c) + (long)pBVar33);
                *(uint *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
                          ((ulong)uVar41 - 0x1c) + (long)pBVar33) = uVar28 | 0x100;
                in_R9 = (BaseRAPass *)((ulong)pBStack_2d8 & 0xffffffff);
                if ((uVar28 & 2) != 0) {
                  puVar6 = (((RAAssignment *)&pBVar47->field_0x48)->_physToWorkMap->dirty)._masks.
                           _data + (long)pBStack_338;
                  *puVar6 = *puVar6 | (uint)pBStack_2d8;
                }
                pBVar50 = (BaseRAPass *)(ulong)(iVar49 - 1);
                this = (RALocalAllocator *)pBVar27;
                pBVar31 = pBStack_328;
                uVar42 = (uint)pBStack_310;
              }
            }
            else {
              pBVar31 = (BaseRAPass *)(ulong)(uVar42 | 1 << (uVar34 & 0x1f));
              uVar42 = (uint)pBStack_310 & ~(1 << (uVar34 & 0x1f));
              if ((uVar28 & uVar42) == 0) {
                if (uVar18 != uVar34) {
                  pBStack_310 = (BaseRAPass *)CONCAT44(pBStack_310._4_4_,uVar42);
                  pBStack_2d8 = (BaseRAPass *)CONCAT44(pBStack_2d8._4_4_,uVar28);
                  pcStack_348 = (code *)0x122b51;
                  pBStack_328 = pBVar31;
                  RAAssignment::reassign
                            ((RAAssignment *)pBStack_308,(RegGroup)pp_Stack_2e0,uVar29,uVar18,
                             (uint)bVar25);
                  pBVar32 = (BaseRAPass *)(pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
                  pcStack_348 = (code *)0x122b66;
                  EVar17 = (*(pBVar32->super_FuncPass).super_Pass._vptr_Pass[9])
                                     (pBVar32,this,pBVar27,(ulong)bVar25);
                  in_R9 = (BaseRAPass *)((ulong)pBStack_2d8 & 0xffffffff);
                  pBVar31 = pBStack_328;
                  uVar42 = (uint)pBStack_310;
                  if (EVar17 != 0) {
                    return EVar17;
                  }
                }
                uVar28 = *(uint *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds).
                                         _data + ((ulong)uVar41 - 0x1c) + (long)pBVar33);
                *(uint *)((long)(((RAAssignment *)&pBVar37->field_0x48)->_physToWorkIds)._data +
                          ((ulong)uVar41 - 0x1c) + (long)pBVar33) = uVar28 | 0x100;
                if ((uVar28 & 2) != 0) {
                  puVar6 = (((RAAssignment *)&pBStack_340->field_0x48)->_physToWorkMap->dirty).
                           _masks._data + (long)pBStack_338;
                  *puVar6 = *puVar6 | (uint)in_R9;
                }
                pBVar50 = (BaseRAPass *)(ulong)(iVar49 - 1);
                pBVar47 = pBStack_340;
              }
            }
            uStack_32c = uStack_32c | 1 << (uVar18 & 0x1f);
            pBVar22 = (BaseRAPass *)(ulong)(uVar42 | (uint)in_R9);
            pBVar39 = pBStack_318;
            in_R8 = pBStack_2f8;
            pBVar52 = pBStack_338;
          }
        }
LAB_00122bd1:
        pBVar33 = (BaseRAPass *)&pBVar33->field_0x20;
        pBVar36 = pBVar39;
        pBVar53 = pBVar52;
      } while (in_R8 != pBVar33);
    }
    pBStack_310 = (BaseRAPass *)CONCAT44(pBStack_310._4_4_,(int)pBVar50);
    if ((uint)pBVar31 != 0) {
      this = (RALocalAllocator *)
             (ulong)(~(uStack_32c | (uint)pBVar31 |
                      (((RAAssignment *)&pBVar47->field_0x48)->_physToWorkMap->assigned)._masks.
                      _data[(long)pBVar53] | uStack_2fc) &
                    (((RARegMask *)&pBVar47->_allocator)->_masks)._data[(long)pBVar53]);
      do {
        uVar41 = 0;
        if ((uint)pBVar31 != 0) {
          for (; ((uint)pBVar31 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
        pBVar33 = (BaseRAPass *)(ulong)uVar41;
        pPVar21 = ((RAAssignment *)&pBVar47->field_0x48)->_physToWorkMap;
        pBVar27 = pBVar33;
        if (((pPVar21->assigned)._masks._data[(long)pBVar53] >> (uVar41 & 0x1f) & 1) != 0) {
          puVar6 = (((RAAssignment *)&pBVar47->field_0x48)->_physToWorkIds)._data[(long)pBVar53];
          uVar28 = puVar6[(long)pBVar33];
          uVar29 = (uint)this;
          pBVar46 = pBVar53;
          pBStack_328 = pBVar31;
          if (uVar29 != 0) {
            pBVar46 = (BaseRAPass *)((ulong)pBVar53 & 0xff);
            pcStack_348 = (code *)0x122ce8;
            in_R8 = (BaseRAPass *)this;
            in_R9 = pBStack_2b0;
            uVar18 = decideOnReassignment
                               ((RALocalAllocator *)pBVar47,(RegGroup)pBVar53,uVar28,
                                (uint32_t)puVar6,uVar29,(RAInst *)pBStack_2b0);
            if (uVar18 != 0xff) {
              if (uVar18 != uVar41) {
                in_R8 = (BaseRAPass *)(ulong)uVar41;
                pcStack_348 = (code *)0x122d4d;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_308,(RegGroup)pBVar53,uVar28,uVar18,uVar41);
                pBVar32 = (BaseRAPass *)(pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_348 = (code *)0x122d62;
                EVar17 = (*(pBVar32->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar32,(ulong)uVar28,(ulong)uVar18,(ulong)uVar41);
                if (EVar17 != 0) {
                  return EVar17;
                }
              }
              pBVar27 = (BaseRAPass *)(ulong)uVar18;
              this = (RALocalAllocator *)(ulong)(uVar29 ^ 1 << (uVar18 & 0x1f));
              puVar6 = (((RARegMask *)&pBStack_340->field_0x28)->_masks)._data + (long)pBStack_338;
              *puVar6 = *puVar6 | 1 << ((byte)uVar18 & 0x1f);
              pBVar36 = pBStack_318;
              pBVar31 = pBStack_328;
              pBVar47 = pBStack_340;
              pBVar53 = pBStack_338;
              goto LAB_00122d90;
            }
            pPVar21 = ((RAAssignment *)&pBVar47->field_0x48)->_physToWorkMap;
            pBVar46 = pBStack_338;
          }
          if (((pPVar21->dirty)._masks._data[(long)pBVar46] & 1 << ((byte)uVar41 & 0x1f)) != 0) {
            pcStack_348 = (code *)0x122d10;
            EVar17 = onSaveReg((RALocalAllocator *)pBVar47,(RegGroup)pBVar46,uVar28,uVar41);
            if (EVar17 != 0) {
              return EVar17;
            }
          }
          pBVar27 = (BaseRAPass *)(ulong)uVar41;
          pcStack_348 = (code *)0x122d2b;
          RAAssignment::unassign((RAAssignment *)pBStack_308,(RegGroup)pBVar46,uVar28,uVar41);
          pBVar36 = pBStack_318;
          pBVar31 = pBStack_328;
          pBVar53 = pBVar46;
        }
LAB_00122d90:
        uVar41 = (uint)pBVar31 - 1 & (uint)pBVar31;
        pBVar31 = (BaseRAPass *)(ulong)uVar41;
      } while (uVar41 != 0);
    }
    pBVar22 = (BaseRAPass *)((ulong)pBStack_310 & 0xffffffff);
    pBVar31 = (BaseRAPass *)(ulong)uStack_330;
    pBVar37 = pBVar36;
    if ((uint)pBStack_310 != 0) {
      pBStack_2d8 = (BaseRAPass *)(ulong)(uint)((int)pBStack_2f0 << 5);
      pBVar27 = (BaseRAPass *)(ulong)(uint)((int)uStack_2b8 << 5);
      pBStack_2c8 = (BaseRAPass *)
                    ((long)&(pBStack_2c8->super_FuncPass).super_Pass._vptr_Pass +
                    (long)&pBVar27->field_0x5a);
      pBStack_2f8 = (BaseRAPass *)((ulong)pBStack_2f8 & 0xffffffff00000000);
      pBVar26 = pBVar47;
      do {
        pBVar38 = pBVar22;
        pBVar47 = pBVar26;
        if ((int)pBVar31 != 0) {
          pBVar46 = (BaseRAPass *)0x0;
          pBStack_310 = (BaseRAPass *)CONCAT44(pBStack_310._4_4_,(int)pBVar22);
          pBVar52 = pBVar53;
LAB_00122df5:
          pBVar53 = pBStack_338;
          pBVar47 = pBStack_340;
          if ((*(byte *)((long)&pBVar36->super_FuncPass + (long)pBVar46 * 0x20 + 9) & 1) != 0)
          goto LAB_001230c8;
          pBVar50 = (BaseRAPass *)((long)&pBVar36->super_FuncPass + (long)pBVar46 * 0x20);
          uVar41 = *(uint *)&(pBVar50->super_FuncPass).super_Pass._vptr_Pass;
          this = (RALocalAllocator *)(ulong)uVar41;
          if ((BaseRAPass *)this != (BaseRAPass *)0xffffffff) {
            in_R9 = pBVar22;
            if ((((RAAssignment *)&pBVar26->field_0x48)->_layout).workCount <= uVar41)
            goto LAB_001236b7;
            bVar25 = ((WorkToPhysMap *)
                     ((long)&(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass +
                     (long)((RAAssignment *)&pBVar26->field_0x48)->_workToPhysMap))->physIds[0];
            pBVar33 = (BaseRAPass *)(ulong)bVar25;
            bVar3 = *(undefined1 *)((long)&(pBVar50->super_FuncPass).super_Pass._cb + 6);
            pBVar26 = (BaseRAPass *)(ulong)bVar3;
            if (bVar3 == bVar25) goto LAB_001236bc;
            pBVar32 = pBVar26;
            if (0x1f < bVar3) goto LAB_001236c1;
            uVar28 = *(uint *)(*(long *)(&pBStack_340->field_0x48 + (long)pBVar52 * 8 + 0x28) +
                              (long)pBVar26 * 4);
            pBVar52 = (BaseRAPass *)(ulong)uVar28;
            uVar42 = (uint)bVar3;
            uVar29 = (uint)bVar25;
            pBStack_328 = pBVar22;
            if (pBVar52 == (BaseRAPass *)0xffffffff) {
LAB_00122fc6:
              pBVar52 = pBStack_338;
              if (bVar25 == 0xff) {
                in_R8 = (BaseRAPass *)0x0;
                pcStack_348 = (code *)0x12301a;
                RAAssignment::assign
                          ((RAAssignment *)pBStack_308,(RegGroup)pBStack_338,uVar41,uVar42,false);
                pBVar32 = (BaseRAPass *)(pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_348 = (code *)0x12302c;
                EVar17 = (*(pBVar32->super_FuncPass).super_Pass._vptr_Pass[0xb])
                                   (pBVar32,this,(ulong)uVar42);
              }
              else {
                in_R8 = (BaseRAPass *)(ulong)uVar29;
                pcStack_348 = (code *)0x122fe9;
                RAAssignment::reassign
                          ((RAAssignment *)pBStack_308,(RegGroup)pBStack_338,uVar41,uVar42,uVar29);
                pBVar32 = (BaseRAPass *)(pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
                pcStack_348 = (code *)0x122ffd;
                EVar17 = (*(pBVar32->super_FuncPass).super_Pass._vptr_Pass[9])
                                   (pBVar32,this,(ulong)uVar42,(ulong)uVar29);
              }
              if (EVar17 != 0) {
                return EVar17;
              }
              uVar41 = *(uint *)&(pBVar50->super_FuncPass).super_Pass._cb;
              uVar28 = uVar41 | 0x100;
              pBVar27 = (BaseRAPass *)(ulong)uVar28;
              *(uint *)&(pBVar50->super_FuncPass).super_Pass._cb = uVar28;
              if ((uVar41 & 2) != 0) {
                pBVar27 = (BaseRAPass *)((RAAssignment *)&pBStack_340->field_0x48)->_physToWorkMap;
                puVar6 = (uint *)((long)(&pBVar27->_formatOptions + -10) + (long)pBVar52 * 4);
                *puVar6 = *puVar6 | 1 << (bVar3 & 0x1f);
              }
              pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_328 - 1);
              pBVar36 = pBStack_318;
LAB_00123085:
              pBVar31 = (BaseRAPass *)(ulong)uStack_330;
              pBVar38 = (BaseRAPass *)((ulong)pBStack_310 & 0xffffffff);
              pBVar26 = pBStack_340;
              goto LAB_001230c8;
            }
            pp_Var44 = (pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
            if (*(uint *)(pp_Var44 + 0x29) <= uVar28) goto LAB_001236c6;
            pBVar27 = pBVar26;
            if ((uVar29 != 0xff) &&
               (pcVar7 = (pBStack_340->super_FuncPass).super_Pass._name,
               bVar4 = *(byte *)((long)(&pBStack_338->_formatOptions + -10) + (long)pcVar7),
               pBVar27 = (BaseRAPass *)
                         (CONCAT71((int7)((ulong)pcVar7 >> 8),bVar4) & 0xffffffffffffff01),
               (bVar4 & 1) != 0)) {
              pp_Stack_2e0 = *(_func_int ***)(pp_Var44[0x28] + (long)pBVar52 * 8);
              pcStack_348 = (code *)0x122ec8;
              RAAssignment::swap((RAAssignment *)pBStack_308,(RegGroup)pBStack_338,uVar41,uVar29,
                                 uVar28,(uint)bVar3);
              pBVar32 = (BaseRAPass *)(pBStack_340->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_348 = (code *)0x122edf;
              EVar17 = (*(pBVar32->super_FuncPass).super_Pass._vptr_Pass[10])
                                 (pBVar32,this,(ulong)uVar29,pBVar52,(ulong)(uint)bVar3);
              if (EVar17 != 0) {
                return EVar17;
              }
              uVar41 = *(uint *)&(pBVar50->super_FuncPass).super_Pass._cb;
              *(uint *)&(pBVar50->super_FuncPass).super_Pass._cb = uVar41 | 0x100;
              if ((uVar41 & 2) != 0) {
                puVar6 = (((RAAssignment *)&pBStack_340->field_0x48)->_physToWorkMap->dirty)._masks.
                         _data + (long)pBStack_338;
                *puVar6 = *puVar6 | 1 << (bVar3 & 0x1f);
              }
              pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_328 - 1);
              pBVar27 = (BaseRAPass *)0x0;
              pBVar38 = (BaseRAPass *)((ulong)pBStack_310 & 0xffffffff);
              do {
                pBVar26 = pBStack_340;
                pBVar36 = pBStack_318;
                in_R8 = pBStack_2d8;
                if (*(int *)(&pBStack_2c8[-1].field_0x3b0 + 0xf2 + (long)pBVar27) ==
                    *(int *)pp_Stack_2e0) {
                  pBVar31 = (BaseRAPass *)(ulong)uStack_330;
                  pBVar52 = pBStack_338;
                  if (*(byte *)((long)&pBStack_2c8[1].super_FuncPass.super_Pass._vptr_Pass +
                               (long)(pBVar27 + -1)) != bVar25) goto LAB_001230c8;
                  uVar41 = *(uint *)(&pBStack_2c8[-1].field_0x3b0 + 0xfa + (long)pBVar27);
                  *(uint *)(&pBStack_2c8[-1].field_0x3b0 + 0xfa + (long)pBVar27) = uVar41 | 0x100;
                  if ((uVar41 & 2) != 0) {
                    pBVar27 = (BaseRAPass *)
                              ((RAAssignment *)&pBStack_340->field_0x48)->_physToWorkMap;
                    puVar6 = (uint *)((long)(&pBVar27->_formatOptions + -10) + (long)pBStack_338 * 4
                                     );
                    *puVar6 = *puVar6 | 1 << (bVar25 & 0x1f);
                  }
                  pBVar22 = (BaseRAPass *)(ulong)((int)pBStack_328 - 2);
                  break;
                }
                pBVar27 = (BaseRAPass *)&pBVar27->field_0x20;
              } while (pBStack_2d8 != pBVar27);
              pBVar31 = (BaseRAPass *)(ulong)uStack_330;
              pBVar52 = pBStack_338;
              goto LAB_001230c8;
            }
            pBVar52 = pBStack_338;
            if (((ulong)pBStack_2f8 & 1) == 0) goto LAB_00123085;
            uVar34 = ~*(uint *)(*(long *)(&pBStack_340->field_0x48 + 0x20) + (long)pBStack_338 * 4)
                     & *(uint *)(&pBStack_340->_allocator + (long)pBStack_338 * 4);
            if (uVar34 == 0) {
              if ((*(uint *)(*(long *)(&pBStack_340->field_0x48 + 0x20) + 0x10 +
                            (long)pBStack_338 * 4) >> (uVar42 & 0x1f) & 1) != 0) {
                pcStack_348 = (code *)0x122fa5;
                EVar17 = onSaveReg((RALocalAllocator *)pBStack_340,(RegGroup)pBStack_338,uVar28,
                                   uVar42);
                if (EVar17 != 0) {
                  return EVar17;
                }
              }
              pcStack_348 = (code *)0x122fc6;
              RAAssignment::unassign
                        ((RAAssignment *)pBStack_308,(RegGroup)pBStack_338,uVar28,uVar42);
              goto LAB_00122fc6;
            }
            uVar28 = ~*(uint *)(&pBStack_340->field_0x38 + (long)pBStack_338 * 4) & uVar34;
            if (uVar28 == 0) {
              uVar28 = uVar34;
            }
            uVar42 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            if (uVar42 != uVar29) {
              in_R8 = (BaseRAPass *)(ulong)uVar29;
              pcStack_348 = (code *)0x123123;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_308,(RegGroup)pBStack_338,uVar41,uVar42,uVar29);
              pp_Var44 = (pBVar47->super_FuncPass).super_Pass._vptr_Pass;
              pcStack_348 = (code *)0x123134;
              EVar17 = (**(code **)(*pp_Var44 + 0x48))(pp_Var44,this,uVar42,bVar25);
              pBVar36 = pBStack_318;
              pBVar46 = pBVar53;
              if (EVar17 != 0) {
                return EVar17;
              }
            }
            pBVar27 = (BaseRAPass *)(ulong)uVar42;
            *(uint *)(&pBVar47->field_0x28 + (long)pBVar53 * 4) =
                 *(uint *)(&pBVar47->field_0x28 + (long)pBVar53 * 4) | 1 << ((byte)uVar42 & 0x1f);
            pBVar31 = (BaseRAPass *)(ulong)uStack_330;
            pBVar38 = (BaseRAPass *)((ulong)pBStack_310 & 0xffffffff);
            goto LAB_001230d9;
          }
          pcStack_348 = (code *)0x1236b7;
          allocInst();
          in_R9 = pBVar22;
LAB_001236b7:
          pcStack_348 = (code *)0x1236bc;
          allocInst();
LAB_001236bc:
          pcStack_348 = (code *)0x1236c1;
          allocInst();
          pBVar32 = pBVar26;
LAB_001236c1:
          pBVar26 = pBVar27;
          pcStack_348 = (code *)0x1236c6;
          allocInst();
LAB_001236c6:
          pcStack_348 = (code *)0x1236cb;
          allocInst();
          goto LAB_001236cb;
        }
LAB_001230d9:
        pBVar27 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar27 >> 8),(int)pBVar38 == (int)pBVar22);
        pBStack_2f8 = (BaseRAPass *)CONCAT44(pBStack_2f8._4_4_,(int)pBVar27);
        pBVar37 = pBVar36;
        pBVar26 = pBVar47;
      } while ((int)pBVar22 != 0);
    }
    cVar56 = uStack_31c == 0;
    pBVar33 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar33 >> 8),cVar56);
    if ((bool)cVar56) {
      pBStack_2f0 = (BaseRAPass *)0x0;
      uStack_31c = 0;
      pBVar51 = (BaseRAPass *)(ulong)uStack_2fc;
      cVar56 = cStack_31d;
    }
    else {
      pBStack_2f0 = (BaseRAPass *)(ulong)uStack_31c;
      pBVar50 = (BaseRAPass *)0x0;
      pBVar51 = (BaseRAPass *)(ulong)uStack_2fc;
      do {
        pBVar46 = (BaseRAPass *)alStack_260[(long)pBVar50];
        uVar41 = *(uint *)&(pBVar46->super_FuncPass).super_Pass._vptr_Pass;
        pBVar31 = (BaseRAPass *)(ulong)uVar41;
        if (pBVar31 == (BaseRAPass *)0xffffffff) goto LAB_001236d5;
        if ((((RAAssignment *)&pBVar47->field_0x48)->_layout).workCount <= uVar41)
        goto LAB_001236da;
        bVar25 = ((WorkToPhysMap *)
                 ((long)&(pBVar31->super_FuncPass).super_Pass._vptr_Pass +
                 (long)((RAAssignment *)&pBVar47->field_0x48)->_workToPhysMap))->physIds[0];
        this = (RALocalAllocator *)(ulong)bVar25;
        uVar28 = (uint)bVar25;
        if (uVar28 != 0xff) {
          pBVar37 = (BaseRAPass *)((ulong)pBStack_338 & 0xff);
          pBVar27 = (BaseRAPass *)(ulong)uVar28;
          pcStack_348 = (code *)0x1231cb;
          pBVar22 = pBStack_308;
          RAAssignment::unassign((RAAssignment *)pBStack_308,(RegGroup)pBStack_338,uVar41,uVar28);
          pBVar51 = (BaseRAPass *)(ulong)((uint)pBVar51 & ~(1 << (bVar25 & 0x1f)));
          pBVar31 = extraout_RDX;
        }
        uStack_31c = (uStack_31c - 1) +
                     (uint)((*(uint *)&(pBVar46->super_FuncPass).super_Pass._cb >> 3 & 1) != 0);
        pBVar50 = (BaseRAPass *)((long)&(pBVar50->super_FuncPass).super_Pass._vptr_Pass + 1);
        pBVar53 = pBStack_338;
      } while (pBStack_2f0 != pBVar50);
    }
  }
  cStack_31d = cVar56;
  uVar41 = (uint)pBVar51;
  pBVar26 = pBVar27;
  pBVar38 = pBVar37;
  pBVar50 = pBVar51;
  while (uVar41 != 0) {
    uVar28 = 0;
    uVar41 = (uint)pBVar50;
    if (uVar41 != 0) {
      for (; (uVar41 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
      }
    }
    this = (RALocalAllocator *)(ulong)uVar28;
    uVar29 = (((RAAssignment *)&pBVar47->field_0x48)->_physToWorkIds)._data[(long)pBVar53]
             [(long)this];
    pBVar33 = (BaseRAPass *)(ulong)uVar29;
    if (uVar29 != 0xffffffff) {
      if (((((RAAssignment *)&pBVar47->field_0x48)->_physToWorkMap->dirty)._masks._data
           [(long)pBVar53] >> (uVar28 & 0x1f) & 1) != 0) {
        pcStack_348 = (code *)0x12323d;
        EVar17 = onSaveReg((RALocalAllocator *)pBVar47,(RegGroup)pBVar53,uVar29,uVar28);
        if (EVar17 != 0) {
          return EVar17;
        }
      }
      pBVar38 = (BaseRAPass *)((ulong)pBVar53 & 0xff);
      pcStack_348 = (code *)0x123257;
      pBVar26 = (BaseRAPass *)this;
      pBVar22 = pBStack_308;
      RAAssignment::unassign((RAAssignment *)pBStack_308,(RegGroup)pBVar53,uVar29,uVar28);
      pBVar31 = extraout_RDX_00;
    }
    uVar41 = uVar41 - 1 & uVar41;
    pBVar50 = (BaseRAPass *)(ulong)uVar41;
  }
  if (uStack_2cc != 0) {
    pBVar50 = (BaseRAPass *)(ulong)uStack_2cc;
    pBVar32 = (BaseRAPass *)0x0;
    do {
      puVar6 = (uint *)auStack_160[(long)pBVar32];
      pBVar46 = (BaseRAPass *)(ulong)puVar6[4];
      if (puVar6[4] != 0) {
        uVar41 = *puVar6;
        this = (RALocalAllocator *)(ulong)uVar41;
        bVar25 = *(byte *)((long)puVar6 + 0xe);
        pBVar33 = (BaseRAPass *)(ulong)bVar25;
        do {
          uVar28 = 0;
          uVar29 = (uint)pBVar46;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          pBVar31 = (BaseRAPass *)(ulong)uVar28;
          if (uVar28 != bVar25) {
            pBVar22 = *(BaseRAPass **)&pBVar47->super_FuncPass;
            pBVar38 = (BaseRAPass *)(ulong)uVar41;
            pBVar26 = (BaseRAPass *)(ulong)(uint)bVar25;
            pcStack_348 = (code *)0x12329e;
            (**(code **)&((BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass)->field_0x48
            )();
            pBVar31 = extraout_RDX_01;
          }
          uVar29 = uVar29 - 1 & uVar29;
          pBVar46 = (BaseRAPass *)(ulong)uVar29;
        } while (uVar29 != 0);
      }
      pBVar32 = (BaseRAPass *)((long)&(pBVar32->super_FuncPass).super_Pass._vptr_Pass + 1);
    } while (pBVar32 != pBVar50);
  }
  if (((pBStack_338 == (BaseRAPass *)0x1) && (pIStack_2c0[0x10] == (InstNode)0x12)) &&
     (uVar41 = *(uint *)(*(long *)(&pBVar47->field_0x48 + 0x20) + 4) & *(uint *)(pIStack_2c0 + 0xa8)
     , pBVar50 = (BaseRAPass *)(ulong)uVar41, uVar41 != 0)) {
    IVar5 = pIStack_2c0[0x8d];
    pBVar33 = (BaseRAPass *)(ulong)(byte)IVar5;
    do {
      uVar41 = 0;
      uVar28 = (uint)pBVar50;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      this = (RALocalAllocator *)(ulong)uVar41;
      pp_Var44 = (pBVar47->super_FuncPass).super_Pass._vptr_Pass;
      pBVar26 = *(BaseRAPass **)(&pBVar47->field_0x48 + 0x30);
      uVar29 = (((RARegMask *)&pBVar26->_allocator)->_masks)._data
               [(long)(&((BaseRAPass *)((long)this + -0x4b0))->field_0x3b0 + 0xfa)];
      pBVar52 = (BaseRAPass *)(ulong)uVar29;
      pBVar39 = pBVar38;
      if (*(uint *)(pp_Var44 + 0x29) <= uVar29) goto LAB_001236fd;
      if ((uint)(byte)IVar5 <
          *(uint *)(*(long *)(*(long *)(pp_Var44[0x28] + (long)pBVar52 * 8) + 8) + 8)) {
        if ((*(uint *)(*(long *)(&pBVar47->field_0x48 + 0x20) + 0x14) >> (uVar41 & 0x1f) & 1) != 0)
        {
          pcStack_348 = (code *)0x12334c;
          EVar17 = onSaveReg((RALocalAllocator *)pBVar47,kVec,uVar29,uVar41);
          if (EVar17 != 0) {
            return EVar17;
          }
        }
        pBVar38 = (BaseRAPass *)0x1;
        pcStack_348 = (code *)0x123368;
        pBVar26 = (BaseRAPass *)this;
        pBVar22 = pBStack_308;
        RAAssignment::unassign((RAAssignment *)pBStack_308,kVec,uVar29,uVar41);
        pBVar31 = extraout_RDX_02;
      }
      uVar28 = uVar28 - 1 & uVar28;
      pBVar50 = (BaseRAPass *)(ulong)uVar28;
    } while (uVar28 != 0);
  }
  uStack_2fc = uStack_2fc | uStack_32c;
  if (uStack_31c != 0) {
    pBStack_318 = (BaseRAPass *)
                  CONCAT44(pBStack_318._4_4_,
                           *(undefined4 *)
                            (*(long *)(&pBVar47->field_0x48 + 0x20) + (long)pBStack_338 * 4));
    if (((int)pBStack_2e8 != 0) &&
       (((ulong)(((FuncPass *)auStack_2a0._16_8_)->super_Pass)._cb & 0x800) != 0)) {
      uVar41 = *(uint *)((long)&(((FuncPass *)auStack_2a0._16_8_)->super_Pass)._name + 4);
      if (uVar41 == 0) {
        return 0x3d;
      }
      pZVar15 = &pBVar47->_allocator;
      pp_Var44 = (pBVar47->super_FuncPass).super_Pass._vptr_Pass;
      pBVar26 = (BaseRAPass *)((ulong)pBStack_2e8 & 0xffffffff);
      pBVar47 = (BaseRAPass *)(ulong)(uint)((int)pBStack_2e8 << 3);
      in_R9 = (BaseRAPass *)0x0;
      in_R8 = (BaseRAPass *)0xffffffff;
      uVar28 = uVar41;
      do {
        uVar29 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        if ((uVar41 >> (uVar29 & 0x1f) & 1) != 0) {
          pBVar50 = (BaseRAPass *)(ulong)uVar29;
          this = (RALocalAllocator *)0xf;
          lVar54 = 0;
          do {
            if ((*(uint *)(pZVar15 + (long)pBStack_338 * 4) >> ((uint)pBVar50 & 0x1f) & 1) == 0) {
              this = (RALocalAllocator *)0x0;
              break;
            }
            if (*(uint *)(pp_Var44 + 0x29) <= **(uint **)(auStack_2a0 + lVar54 + 0x10)) {
LAB_00123696:
              pcStack_348 = (code *)0x12369b;
              allocInst();
              return 0x3d;
            }
            pBVar46 = (BaseRAPass *)
                      (ulong)*(byte *)(*(long *)(pp_Var44[0x28] +
                                                (ulong)**(uint **)(auStack_2a0 + lVar54 + 0x10) * 8)
                                      + 0x4a);
            pBVar33 = (BaseRAPass *)(ulong)(pBVar50 == pBVar46);
            this = (RALocalAllocator *)(ulong)((int)this + (uint)(pBVar50 == pBVar46));
            lVar54 = lVar54 + 8;
            pBVar50 = (BaseRAPass *)((long)&(pBVar50->super_FuncPass).super_Pass._vptr_Pass + 1);
          } while (pBVar47 != (BaseRAPass *)lVar54);
          if ((uint)in_R9 < (uint)this) {
            in_R8 = (BaseRAPass *)(ulong)uVar29;
            in_R9 = (BaseRAPass *)this;
          }
        }
        uVar28 = uVar28 - 1 & uVar28;
      } while (uVar28 != 0);
      if ((int)in_R8 == -1) {
        return 0x3d;
      }
      pBVar31 = (BaseRAPass *)0x0;
      do {
        pBVar38 = (BaseRAPass *)alStack_260[(long)&pBVar31[-1].field_0x4aa];
        uVar41 = (int)in_R8 + (int)pBVar31;
        pBVar22 = (BaseRAPass *)(ulong)uVar41;
        *(char *)((long)&(pBVar38->super_FuncPass).super_Pass._cb + 7) = (char)uVar41;
        pBVar31 = (BaseRAPass *)((long)&(pBVar31->super_FuncPass).super_Pass._vptr_Pass + 1);
      } while (pBVar26 != pBVar31);
    }
    pBVar39 = pBVar38;
    pBVar52 = pBStack_338;
    if (cStack_31d == '\0') {
      pBVar46 = (BaseRAPass *)0x0;
      pBStack_328 = (BaseRAPass *)((ulong)pBStack_328 & 0xffffffff00000000);
      pBVar50 = pBStack_338;
      do {
        pBVar47 = (BaseRAPass *)alStack_260[(long)pBVar46];
        uVar41 = *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb;
        pBVar51 = (BaseRAPass *)(ulong)uVar41;
        pBVar52 = pBVar50;
        if ((uVar41 & 8) != 0) {
          uVar28 = *(uint *)&(pBVar47->super_FuncPass).super_Pass._vptr_Pass;
          this = (RALocalAllocator *)(ulong)uVar28;
          pBVar27 = pBVar26;
          pBVar37 = pBVar38;
          if ((BaseRAPass *)this == (BaseRAPass *)0xffffffff) goto LAB_001236df;
          if ((((RAAssignment *)&pBStack_340->field_0x48)->_layout).workCount <= uVar28)
          goto LAB_001236e4;
          bVar25 = ((WorkToPhysMap *)
                   ((long)&(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass +
                   (long)((RAAssignment *)&pBStack_340->field_0x48)->_workToPhysMap))->physIds[0];
          pBVar27 = (BaseRAPass *)(ulong)bVar25;
          RVar16 = (RegGroup)pBVar50;
          if (bVar25 != 0xff) {
            pBVar38 = (BaseRAPass *)((ulong)pBVar50 & 0xff);
            pcStack_348 = (code *)0x123503;
            pBVar22 = pBStack_308;
            RAAssignment::unassign((RAAssignment *)pBStack_308,RVar16,uVar28,(uint)bVar25);
            pBVar31 = extraout_RDX_03;
          }
          pBVar52 = pBStack_340;
          bVar25 = *(undefined1 *)((long)&(pBVar47->super_FuncPass).super_Pass._cb + 7);
          pBVar33 = (BaseRAPass *)(ulong)bVar25;
          pBVar26 = pBVar33;
          if (bVar25 == 0xff) {
            uVar41 = ~((int)(short)uVar41 >> 0xf & uStack_32c | (uint)pBStack_328) &
                     *(uint *)((long)&(pBVar47->super_FuncPass).super_Pass._name + 4);
            pBVar27 = (BaseRAPass *)(ulong)uVar41;
            uVar29 = ~(uint)pBStack_318 & uVar41;
            in_R8 = (BaseRAPass *)(ulong)uVar29;
            pBVar22 = pBStack_340;
            if (uVar29 != 0) {
              pBVar38 = (BaseRAPass *)((ulong)pBVar50 & 0xff);
              pcStack_348 = (code *)0x123547;
              uVar18 = decideOnAssignment((RALocalAllocator *)pBStack_340,RVar16,uVar28,uVar41,
                                          uVar29);
              pBVar26 = (BaseRAPass *)(ulong)uVar18;
              pBVar31 = extraout_RDX_04;
              goto LAB_00123549;
            }
            pBVar26 = (BaseRAPass *)(ulong)(uVar41 & (uint)pBStack_318);
            pBVar36 = (BaseRAPass *)((ulong)pBVar50 & 0xff);
            uStack_330 = (uint)pBVar36;
            in_R8 = (BaseRAPass *)auStack_2a0;
            pcStack_348 = (code *)0x1235ec;
            uVar18 = decideOnSpillFor((RALocalAllocator *)pBStack_340,RVar16,(uint32_t)pBVar31,
                                      uVar41 & (uint)pBStack_318,(uint32_t *)in_R8);
            workId = auStack_2a0._0_4_;
            if (0x1f < uVar18) goto LAB_0012371b;
            pBVar33 = (BaseRAPass *)(ulong)uVar18;
            bVar25 = (byte)uVar18;
            if ((*(uint *)(*(long *)(&pBVar52->field_0x48 + 0x20) + 0x10 + (long)pBVar50 * 4) >>
                 (uVar18 & 0x1f) & 1) != 0) {
              pcStack_348 = (code *)0x12362c;
              EVar17 = onSaveReg((RALocalAllocator *)pBVar52,(RegGroup)uStack_330,auStack_2a0._0_4_,
                                 uVar18);
              if (EVar17 != 0) {
                return EVar17;
              }
            }
            pBVar38 = (BaseRAPass *)(ulong)uStack_330;
            pBVar26 = (BaseRAPass *)(ulong)uVar18;
            pcStack_348 = (code *)0x123643;
            pBVar22 = pBStack_308;
            RAAssignment::unassign((RAAssignment *)pBStack_308,(RegGroup)uStack_330,workId,uVar18);
            pBVar31 = extraout_RDX_06;
            pBVar52 = pBStack_338;
          }
          else {
LAB_00123549:
            pBVar52 = pBVar50;
            if (0x1f < (uint)pBVar26) goto LAB_001236ee;
            bVar25 = (byte)pBVar26;
            pBVar33 = pBVar26;
          }
          uVar41 = 1 << (bVar25 & 0x1f);
          pBVar51 = (BaseRAPass *)(ulong)uVar41;
          pBVar27 = pBVar26;
          if (((((RAAssignment *)&pBStack_340->field_0x48)->_physToWorkMap->assigned)._masks._data
               [(long)pBVar52] & uVar41) != 0) goto LAB_001236e9;
          uVar29 = *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb;
          if ((uVar29 >> 0x12 & 1) == 0) {
            pBVar38 = (BaseRAPass *)((ulong)pBVar52 & 0xff);
            in_R8 = (BaseRAPass *)0x1;
            pcStack_348 = (code *)0x123591;
            pBVar26 = pBVar33;
            pBVar22 = pBStack_308;
            RAAssignment::assign
                      ((RAAssignment *)pBStack_308,(RegGroup)pBVar52,uVar28,(uint32_t)pBVar33,true);
            uVar29 = *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb;
            pBVar31 = extraout_RDX_05;
          }
          *(char *)((long)&(pBVar47->super_FuncPass).super_Pass._cb + 7) = (char)pBVar33;
          *(uint *)&(pBVar47->super_FuncPass).super_Pass._cb = uVar29 | 0x200;
          pBStack_328 = (BaseRAPass *)CONCAT44(pBStack_328._4_4_,(uint)pBStack_328 | uVar41);
          pBVar51 = (BaseRAPass *)(ulong)~uVar41;
          pBStack_318 = (BaseRAPass *)CONCAT44(pBStack_318._4_4_,(uint)pBStack_318 & ~uVar41);
          uStack_31c = uStack_31c - 1;
        }
        pBVar46 = (BaseRAPass *)((long)&(pBVar46->super_FuncPass).super_Pass._vptr_Pass + 1);
        pBVar50 = pBVar52;
      } while (pBStack_2f0 != pBVar46);
      pBVar39 = pBVar38;
      pBVar47 = pBStack_340;
      pBVar50 = pBVar51;
      if (uStack_31c == 0) {
        uStack_2fc = uStack_2fc | (uint)pBStack_328;
        pBStack_338 = pBVar52;
        goto LAB_00123674;
      }
    }
    goto LAB_00123725;
  }
LAB_00123674:
  puVar6 = (((RARegMask *)&pBVar47->field_0x28)->_masks)._data + (long)pBStack_338;
  *puVar6 = *puVar6 | uStack_2fc;
  pBVar52 = (BaseRAPass *)((long)&(pBStack_338->super_FuncPass).super_Pass._vptr_Pass + 1);
  pBVar32 = pBVar47;
  if (pBVar52 == (BaseRAPass *)0x4) {
    return 0;
  }
  goto LAB_001224bb;
LAB_001230c8:
  pBVar53 = pBVar52;
  pBVar46 = (BaseRAPass *)((long)&(pBVar46->super_FuncPass).super_Pass._vptr_Pass + 1);
  in_R9 = pBVar22;
  pBVar47 = pBVar26;
  pBVar52 = pBVar53;
  if (pBVar46 == pBStack_2f0) goto LAB_001230d9;
  goto LAB_00122df5;
code_r0x001238f8:
  uVar29 = (uint)(*(float *)(*(long *)(lVar54 + (long)pBVar50 * 8) + 100) * 1048576.0);
  pBVar52 = (BaseRAPass *)(ulong)uVar29;
  pBVar46 = (BaseRAPass *)(ulong)(uVar29 + 0x40000);
  if ((uVar34 >> (uVar43 & 0x1f) & 1) == 0) {
    pBVar46 = pBVar52;
  }
  bVar55 = (uint)pBVar46 < (uint)pBVar37;
  if (bVar55) {
    pBVar31 = pBVar50;
    pBVar37 = pBVar46;
  }
  uVar29 = (uint)pBVar31;
  if (bVar55) {
    uVar28 = uVar43;
  }
  uVar41 = uVar41 - 1 & uVar41;
  pBVar33 = (BaseRAPass *)(ulong)uVar41;
  if (uVar41 == 0) goto LAB_00123933;
  goto LAB_001238eb;
  while (lVar45 = lVar45 + 0x20, (ulong)bVar25 * 0x20 != lVar45) {
LAB_00123806:
    if (*(uint *)((long)(((RAAssignment *)&in_R9->field_0x48)->_physToWorkIds)._data +
                 lVar45 + (ulong)(uVar41 << 5) + -0x24) == extraout_EDX_00) {
      if ((*(uint *)((long)(((RAAssignment *)&in_R9->field_0x48)->_physToWorkIds)._data +
                    lVar45 + (ulong)(uVar41 << 5) + -0x1c) & 0x40008) != 0) {
        EVar17 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> EVar17 & 1) == 0; EVar17 = EVar17 + 1) {
          }
          return EVar17;
        }
        return 0;
      }
      break;
    }
  }
LAB_0012382f:
  if ((*(byte *)(lVar54 + 0x24) & 4) != 0) {
    return 0xff;
  }
  uVar28 = ~*(uint *)(lVar54 + 0x38) & uVar28;
  if (uVar28 != 0) {
    uVar41 = ~(((RARegMask *)&pBVar22->field_0x38)->_masks)._data[(ulong)pBVar39 & 0xff] & uVar28;
    if (uVar41 == 0) {
      uVar41 = uVar28;
    }
    EVar17 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> EVar17 & 1) == 0; EVar17 = EVar17 + 1) {
      }
      return EVar17;
    }
    return 0;
  }
  return 0xff;
LAB_001236cb:
  pcStack_348 = (code *)0x1236d0;
  allocInst();
  pBVar22 = pBVar38;
  pBVar47 = pBVar32;
  pBVar51 = pBVar50;
LAB_001236d0:
  pBVar50 = pBVar52;
  pBVar37 = pBVar36;
  pBVar27 = pBVar26;
  pcStack_348 = (code *)0x1236d5;
  allocInst();
LAB_001236d5:
  pcStack_348 = (code *)0x1236da;
  allocInst();
LAB_001236da:
  pcStack_348 = (code *)0x1236df;
  allocInst();
LAB_001236df:
  pcStack_348 = (code *)0x1236e4;
  allocInst();
  pBVar38 = pBVar37;
  pBVar52 = pBVar50;
LAB_001236e4:
  pcStack_348 = (code *)0x1236e9;
  allocInst();
LAB_001236e9:
  pBVar26 = pBVar33;
  pcStack_348 = (code *)0x1236ee;
  allocInst();
LAB_001236ee:
  pcStack_348 = (code *)0x1236f3;
  allocInst();
LAB_001236f3:
  pcStack_348 = (code *)0x1236f8;
  allocInst();
  pBVar33 = pBVar26;
  pBVar50 = pBVar51;
LAB_001236f8:
  pcStack_348 = (code *)0x1236fd;
  allocInst();
  pBVar26 = pBVar27;
  pBVar39 = pBVar38;
LAB_001236fd:
  pcStack_348 = (code *)0x123702;
  allocInst();
LAB_00123702:
  pcStack_348 = (code *)0x123707;
  allocInst();
LAB_00123707:
  pcStack_348 = (code *)0x12370c;
  allocInst();
  pBVar36 = pBVar39;
  pBVar32 = pBVar47;
LAB_0012370c:
  pcStack_348 = (code *)0x123711;
  allocInst();
LAB_00123711:
  pcStack_348 = (code *)0x123716;
  allocInst();
LAB_00123716:
  pcStack_348 = (code *)0x12371b;
  allocInst();
  pBVar47 = pBVar32;
LAB_0012371b:
  pcStack_348 = (code *)0x123720;
  allocInst();
  pBVar39 = pBVar36;
LAB_00123720:
  pcStack_348 = (code *)0x123725;
  allocInst();
LAB_00123725:
  pcStack_348 = decideOnAssignment;
  allocInst();
  uVar41 = (uint)in_R8;
  if (uVar41 == 0) {
    pBStack_350 = (BaseRAPass *)0x123782;
    decideOnAssignment();
LAB_00123782:
    pBStack_350 = (BaseRAPass *)0x123787;
    decideOnAssignment();
  }
  else {
    pBVar32 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)&pBVar32->field_0x148 <= extraout_EDX) goto LAB_00123782;
    pBVar26 = *(BaseRAPass **)(*(long *)&pBVar32->_workRegs + (ulong)extraout_EDX * 8);
    bVar25 = (((RAAssignment *)&pBVar26->field_0x48)->_layout).physIndex.super_RARegCount.field_0.
             _regs[2];
    if ((bVar25 != 0xff) && ((uVar41 >> (bVar25 & 0x1f) & 1) != 0)) {
      return (uint)bVar25;
    }
    if ((byte)pBVar39 < 4) {
      uVar28 = (((RARegMask *)&pBVar26->field_0x38)->_masks)._data[1] & uVar41;
      if (uVar28 == 0) {
        uVar28 = uVar41;
      }
      uVar41 = ~(((RARegMask *)&pBVar22->field_0x38)->_masks)._data[(ulong)pBVar39 & 0xff] & uVar28;
      if (uVar41 == 0) {
        uVar41 = uVar28;
      }
      EVar17 = 0;
      if (uVar41 != 0) {
        for (; (uVar41 >> EVar17 & 1) == 0; EVar17 = EVar17 + 1) {
        }
        return EVar17;
      }
      return 0;
    }
  }
  uVar41 = (uint)pBVar26;
  pBStack_350 = (BaseRAPass *)decideOnReassignment;
  decideOnAssignment();
  uVar28 = (uint)in_R8;
  pBStack_350 = (BaseRAPass *)this;
  if (uVar28 == 0) {
    pBStack_358 = (BaseRAPass *)0x12385b;
    decideOnReassignment();
  }
  else {
    pBVar32 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
    if (extraout_EDX_00 < *(uint *)&pBVar32->field_0x148) {
      lVar54 = *(long *)(*(long *)&pBVar32->_workRegs + (ulong)extraout_EDX_00 * 8);
      bVar25 = *(byte *)(lVar54 + 0x4a);
      if ((bVar25 != 0xff) && ((uVar28 >> (bVar25 & 0x1f) & 1) != 0)) {
        return (uint)bVar25;
      }
      uVar41 = extraout_EDX_00;
      if ((byte)pBVar39 < 4) {
        bVar25 = *(byte *)((long)(((RARegMask *)&in_R9->_allocator)->_masks)._data +
                          ((ulong)pBVar39 & 0xff));
        if (bVar25 == 0) goto LAB_0012382f;
        uVar41 = *(uint *)((long)&(in_R9->super_FuncPass).super_Pass._name + 4) >>
                 ((byte)pBVar39 * '\b' & 0x1f) & 0xff;
        lVar45 = 0;
        goto LAB_00123806;
      }
      goto LAB_00123860;
    }
  }
  pBStack_358 = (BaseRAPass *)0x123860;
  decideOnReassignment();
LAB_00123860:
  pBStack_358 = (BaseRAPass *)0x123865;
  decideOnReassignment();
  pBVar32 = (BaseRAPass *)this;
  pBStack_378 = (BaseRAPass *)this;
  pBStack_370 = pBVar46;
  pBStack_368 = pBVar50;
  pBStack_360 = pBVar52;
  pBStack_358 = pBVar33;
  if (uVar41 == 0) goto LAB_00123944;
  if (3 < (byte)pBVar39) goto LAB_00123949;
  uVar28 = 0;
  if (uVar41 != 0) {
    for (; (uVar41 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
    }
  }
  uVar30 = (ulong)pBVar39 & 0xff;
  pBVar39 = (BaseRAPass *)(((RAAssignment *)&pBVar22->field_0x48)->_physToWorkIds)._data[uVar30];
  uVar29 = (((RARegMask *)&pBVar39->_allocator)->_masks)._data[(ulong)uVar28 - 6];
  pBVar31 = (BaseRAPass *)(ulong)uVar29;
  uVar41 = uVar41 - 1 & uVar41;
  if (uVar41 == 0) {
LAB_00123933:
    *(uint *)&(in_R8->super_FuncPass).super_Pass._vptr_Pass = uVar29;
    return uVar28;
  }
  pBVar37 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
  uVar42 = *(uint *)&pBVar37->field_0x148;
  if (uVar29 < uVar42) {
    lVar54 = *(long *)&pBVar37->_workRegs;
    uVar43 = (uint)(*(float *)(*(long *)(lVar54 + (long)pBVar31 * 8) + 100) * 1048576.0);
    uVar34 = (((RAAssignment *)&pBVar22->field_0x48)->_physToWorkMap->dirty)._masks._data[uVar30];
    pBVar22 = (BaseRAPass *)(ulong)uVar34;
    uVar29 = uVar43 + 0x40000;
    if ((uVar34 >> (uVar28 & 0x1f) & 1) == 0) {
      uVar29 = uVar43;
    }
    pBVar37 = (BaseRAPass *)(ulong)uVar29;
LAB_001238eb:
    uVar43 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
      }
    }
    pBVar32 = (BaseRAPass *)(ulong)uVar43;
    uVar29 = (((RARegMask *)&pBVar39->_allocator)->_masks)._data
             [(long)(&pBVar32[-1].field_0x3b0 + 0xfa)];
    pBVar50 = (BaseRAPass *)(ulong)uVar29;
    if (uVar29 < uVar42) goto code_r0x001238f8;
    pBStack_380 = (BaseRAPass *)0x123944;
    decideOnSpillFor();
LAB_00123944:
    pBStack_380 = (BaseRAPass *)0x123949;
    decideOnSpillFor();
LAB_00123949:
    pBStack_380 = (BaseRAPass *)0x12394e;
    decideOnSpillFor();
  }
  pBStack_380 = (BaseRAPass *)0x123953;
  decideOnSpillFor();
  lVar54 = *(long *)&pBVar39->field_0x20;
  pIVar35 = (InstNode *)(ulong)*(uint *)(lVar54 + 0x10);
  if (pIVar35 != (InstNode *)0x0) {
    pBStack_3c0 = (BaseRAPass *)&pBVar22->field_0x48;
    lVar45 = lVar54 + 0x54;
    pIVar48 = (InstNode *)0x0;
    pBVar31 = pBVar22;
    pIStack_3b8 = pIVar35;
    pBStack_3b0 = pBVar39;
    pBStack_3a8 = pBVar32;
    pBStack_3a0 = pBVar46;
    pBStack_398 = pBVar47;
    pBStack_390 = pBVar50;
    pBStack_388 = pBVar52;
    pBStack_380 = pBVar33;
    do {
      if ((InstNode *)(ulong)*(uint *)(lVar54 + 0x10) <= pIVar48) {
        pBStack_3d8 = (BaseRAPass *)0x123a70;
        spillAfterAllocation();
LAB_00123a70:
        pBStack_3d8 = (BaseRAPass *)0x123a75;
        spillAfterAllocation();
LAB_00123a75:
        pBStack_3d8 = (BaseRAPass *)0x123a7a;
        spillAfterAllocation();
LAB_00123a7a:
        pBStack_3d8 = (BaseRAPass *)0x123a7f;
        spillAfterAllocation();
LAB_00123a7f:
        pBStack_3d8 = (BaseRAPass *)allocBranch;
        spillAfterAllocation();
        (((BaseCompiler *)(pBVar31->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
             *(BaseNode **)pIVar35;
        lStack_400 = lVar45;
        pBStack_3f8 = pBVar46;
        pIStack_3f0 = pIVar48;
        pBStack_3e8 = pBVar22;
        lStack_3e0 = lVar54;
        pBStack_3d8 = pBVar33;
        if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
           (EVar17 = switchToAssignment((RALocalAllocator *)pBVar31,*(PhysToWorkMap **)(block + 200)
                                        ,(ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true),
           EVar17 != 0)) {
          return EVar17;
        }
        EVar17 = allocInst((RALocalAllocator *)pBVar31,pIVar35);
        if (EVar17 != 0) {
          return EVar17;
        }
        uVar41 = *(uint *)(block + 0xb8);
        if ((ulong)uVar41 == 0xffffffff) {
          pRVar23 = block + 0xbc;
LAB_00123b18:
          EVar17 = spillScratchGpRegsBeforeEntry((RALocalAllocator *)pBVar31,*(RegMask *)pRVar23);
          if (EVar17 != 0) {
            return EVar17;
          }
          pBVar32 = (BaseRAPass *)(pBVar31->super_FuncPass).super_Pass._vptr_Pass;
          if (*(long *)(block + 200) == 0) {
            EVar17 = BaseRAPass::setBlockEntryAssignment
                               (pBVar32,block,*(RABlock **)&pBVar31->field_0xd8,
                                (RAAssignment *)&pBVar31->field_0x48);
            if (EVar17 != 0) {
              return EVar17;
            }
          }
          else {
            pBVar9 = *(BaseNode **)pBVar32->_extraBlock;
            pBVar24 = BaseBuilder::setCursor
                                ((BaseBuilder *)(pBVar31->super_FuncPass).super_Pass._cb,pBVar9);
            __src = ((RAAssignment *)&pBVar31->field_0x48)->_workToPhysMap;
            memcpy(*(PhysToWorkMap **)&(pBVar31->_blocks).field_0x0,
                   ((RAAssignment *)&pBVar31->field_0x48)->_physToWorkMap,
                   (ulong)*(uint *)&pBVar31->_func * 4 + 0x20);
            memcpy(pBVar31->_extraBlock,__src,(ulong)*(uint32_t *)((long)&pBVar31->_func + 4));
            EVar17 = switchToAssignment((RALocalAllocator *)pBVar31,*(PhysToWorkMap **)(block + 200)
                                        ,(ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
            if (EVar17 != 0) {
              return EVar17;
            }
            pBVar40 = (BaseCompiler *)(pBVar31->super_FuncPass).super_Pass._cb;
            if ((pBVar40->super_BaseBuilder)._cursor != pBVar9) {
              if ((uint)(byte)pIVar35[0x13] <= (byte)pIVar35[0x12] - 1) goto LAB_00123cba;
              lVar54 = (ulong)((byte)pIVar35[0x12] - 1) * 0x10;
              if ((*(uint *)(pIVar35 + lVar54 + 0x40) & 7) != 5) goto LAB_00123cbf;
              (*(pBVar40->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_428);
              uStack_418 = *(undefined8 *)(pIVar35 + lVar54 + 0x40);
              uStack_410 = *(undefined8 *)(pIVar35 + lVar54 + 0x48);
              *(undefined4 *)(pIVar35 + lVar54 + 0x40) = uStack_428;
              *(undefined4 *)(pIVar35 + lVar54 + 0x44) = uStack_424;
              *(undefined4 *)(pIVar35 + lVar54 + 0x48) = uStack_420;
              *(undefined4 *)(pIVar35 + lVar54 + 0x4c) = uStack_41c;
              pIVar35[0x34] = (InstNode)((byte)pIVar35[0x34] & 0xef);
              EVar17 = (*(((BaseRAPass *)(pBVar31->super_FuncPass).super_Pass._vptr_Pass)->
                         super_FuncPass).super_Pass._vptr_Pass[0xd])();
              if (EVar17 != 0) {
                return EVar17;
              }
              pBVar40 = (BaseCompiler *)(pBVar31->super_FuncPass).super_Pass._cb;
              (pBVar40->super_BaseBuilder)._cursor = pBVar9;
              (*(pBVar40->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar40,&uStack_428);
              pBVar40 = (BaseCompiler *)(pBVar31->super_FuncPass).super_Pass._cb;
            }
            (pBVar40->super_BaseBuilder)._cursor = pBVar24;
            pBVar9 = (BaseNode *)((RAAssignment *)&pBVar31->field_0x48)->_workToPhysMap;
            pPVar21 = ((RAAssignment *)&pBVar31->field_0x48)->_physToWorkMap;
            pPVar11 = *(PhysToWorkMap **)&(pBVar31->_blocks).field_0x0;
            ((RAAssignment *)&pBVar31->field_0x48)->_workToPhysMap =
                 (WorkToPhysMap *)pBVar31->_extraBlock;
            ((RAAssignment *)&pBVar31->field_0x48)->_physToWorkMap = pPVar11;
            pBVar31->_extraBlock = pBVar9;
            *(PhysToWorkMap **)&(pBVar31->_blocks).field_0x0 = pPVar21;
            lVar54 = 0;
            do {
              ppuVar2 = (((RAAssignment *)&pBVar31->field_0x48)->_physToWorkIds)._data + lVar54;
              puVar6 = *ppuVar2;
              puVar12 = ppuVar2[1];
              puVar13 = (uint *)((undefined8 *)((long)(&pBVar31->_formatOptions + 4) + lVar54 * 8))
                                [1];
              ppuVar2 = (((RAAssignment *)&pBVar31->field_0x48)->_physToWorkIds)._data + lVar54;
              *ppuVar2 = *(uint **)((long)(&pBVar31->_formatOptions + 4) + lVar54 * 8);
              ppuVar2[1] = puVar13;
              *(undefined8 *)((long)(&pBVar31->_formatOptions + 4) + lVar54 * 8) = puVar6;
              ((undefined8 *)((long)(&pBVar31->_formatOptions + 4) + lVar54 * 8))[1] = puVar12;
              lVar54 = lVar54 + 2;
            } while (lVar54 != 4);
          }
          EVar17 = 0;
        }
        else {
          if (uVar41 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar23 = (RABlock *)((ulong)uVar41 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_00123b18;
          }
          allocBranch();
LAB_00123cba:
          allocBranch();
LAB_00123cbf:
          EVar17 = 3;
        }
        return EVar17;
      }
      if ((*(byte *)(lVar45 + 2) & 2) != 0) {
        uVar41 = *(uint *)(lVar45 + -8);
        pBVar46 = (BaseRAPass *)(ulong)uVar41;
        pBVar32 = (BaseRAPass *)(pBVar22->super_FuncPass).super_Pass._vptr_Pass;
        if (*(uint *)&pBVar32->field_0x148 <= uVar41) goto LAB_00123a70;
        lVar8 = *(long *)(*(long *)&pBVar32->_workRegs + (long)pBVar46 * 8);
        if (*(char *)(lVar8 + 0x4a) != -1) goto LAB_00123a4a;
        if ((((RAAssignment *)&pBVar22->field_0x48)->_layout).workCount <= uVar41)
        goto LAB_00123a75;
        bVar25 = ((RAAssignment *)&pBVar22->field_0x48)->_workToPhysMap[(long)pBVar46].physIds[0];
        pBVar33 = (BaseRAPass *)(ulong)bVar25;
        if (bVar25 == 0xff) goto LAB_00123a4a;
        RVar16 = *(RegGroup *)(lVar8 + 0x21);
        (((BaseCompiler *)(pBVar22->super_FuncPass).super_Pass._cb)->super_BaseBuilder)._cursor =
             (BaseNode *)pBStack_3b0;
        if (0x1f < bVar25) goto LAB_00123a7a;
        RVar16 = RVar16 & kMaxValue;
        if (RVar16 < kPC) {
          if (((((RAAssignment *)&pBVar22->field_0x48)->_physToWorkMap->dirty)._masks._data[RVar16]
               >> (bVar25 & 0x1f) & 1) != 0) {
            pBStack_3d8 = (BaseRAPass *)0x123a2d;
            uStack_3c8 = (ulong)RVar16;
            EVar17 = onSaveReg((RALocalAllocator *)pBVar22,RVar16,uVar41,(uint)bVar25);
            RVar16 = (RegGroup)uStack_3c8;
            if (EVar17 != 0) {
              return EVar17;
            }
          }
          pBStack_3d8 = (BaseRAPass *)0x123a45;
          pBVar31 = pBStack_3c0;
          RAAssignment::unassign((RAAssignment *)pBStack_3c0,RVar16,uVar41,(uint)bVar25);
          pIVar35 = pIStack_3b8;
          goto LAB_00123a4a;
        }
        goto LAB_00123a7f;
      }
LAB_00123a4a:
      pIVar48 = pIVar48 + 1;
      lVar45 = lVar45 + 0x20;
    } while (pIVar35 != pIVar48);
  }
  return 0;
}

Assistant:

Error RALocalAllocator::spillScratchGpRegsBeforeEntry(RegMask scratchRegs) noexcept {
  RegGroup group = RegGroup::kGp;
  Support::BitWordIterator<RegMask> it(scratchRegs);

  while (it.hasNext()) {
    uint32_t physId = it.next();
    if (_curAssignment.isPhysAssigned(group, physId)) {
      uint32_t workId = _curAssignment.physToWorkId(group, physId);
      ASMJIT_PROPAGATE(onSpillReg(group, workId, physId));
    }
  }

  return kErrorOk;
}